

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O2

void CodegenC::codegen(Program *program,char *source_path,TailCallData *tail_call_data)

{
  Function *pFVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *__s;
  char *__rhs;
  allocator<char> local_9f1;
  string command;
  IndentPrinter printer;
  Printer status_printer;
  string c_path;
  size_t arguments;
  char *local_980;
  char *local_978;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_960;
  char *local_958;
  Function *local_948;
  Variable result;
  Type result_type;
  IndentPrinter type_declaration_printer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  IndentPrinter function_declaration_printer;
  string executable_path;
  IndentPrinter type_function_printer;
  FunctionTable function_table;
  ostringstream functions;
  ostringstream type_functions;
  ostringstream function_declarations;
  ostringstream type_declarations;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&type_declarations);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&function_declarations);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&type_functions);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&functions);
  function_table.type_declaration_printer = &type_declaration_printer;
  type_declaration_printer.indentation = 0;
  function_table.function_declaration_printer = &function_declaration_printer;
  function_declaration_printer.indentation = 0;
  function_table.type_function_printer = &type_function_printer;
  type_function_printer.indentation = 0;
  printer.indentation = 0;
  function_table.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table.functions._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table.functions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  function_table.types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table.types._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table.types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table.types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table.types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  function_table.next_type_index = 0;
  printer.printer.ostream = (ostream *)&functions;
  type_declaration_printer.printer.ostream = (ostream *)&type_declarations;
  function_declaration_printer.printer.ostream = (ostream *)&function_declarations;
  type_function_printer.printer.ostream = (ostream *)&type_functions;
  function_table.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  function_table.types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table.types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  IndentPrinter::println<char[20]>
            (function_table.type_declaration_printer,(char (*) [20])"#include <stdlib.h>");
  IndentPrinter::println<char[20]>(&type_declaration_printer,(char (*) [20])"#include <stdint.h>");
  IndentPrinter::println<char[19]>(&type_declaration_printer,(char (*) [19])"#include <stdio.h>");
  IndentPrinter::println_increasing<char[34]>
            (&printer,(char (*) [34])"int main(int argc, char **argv) {");
  sVar4 = FunctionTable::look_up(&function_table,program->first);
  executable_path._M_dataplus._M_p = (pointer)&c_path;
  c_path._M_dataplus._M_p._0_4_ = (int)sVar4;
  executable_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_37de9;
  IndentPrinter::println<Format<PrintNumber>>(&printer,(Format<PrintNumber> *)&executable_path);
  IndentPrinter::println<char[10]>(&printer,(char (*) [10])"return 0;");
  IndentPrinter::println_decreasing<char[2]>(&printer,(char (*) [2])0x13589a);
  while( true ) {
    pFVar1 = program->first;
    if (pFVar1 == (Function *)0x0) break;
    c_path._M_dataplus._M_p = (pointer)pFVar1;
    command._M_dataplus._M_p = (pointer)FunctionTable::get_type(&function_table,pFVar1->return_type)
    ;
    index = FunctionTable::look_up(&function_table,(Function *)c_path._M_dataplus._M_p);
    arguments = *(long *)(c_path._M_dataplus._M_p + 0x40) -
                *(long *)(c_path._M_dataplus._M_p + 0x38) >> 3;
    local_948 = pFVar1;
    executable_path._M_dataplus._M_p = (pointer)&command;
    executable_path._M_string_length = (size_type)&index;
    executable_path.field_2._M_allocated_capacity = (size_type)&arguments;
    executable_path.field_2._8_8_ = &c_path;
    IndentPrinter::
    println<PrintFunctor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_1_>>
              (&function_declaration_printer,
               (PrintFunctor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]moebius_codegen_c_hpp:992:55)>
                *)&executable_path);
    executable_path._M_dataplus._M_p = (pointer)&command;
    executable_path._M_string_length = (size_type)&index;
    executable_path.field_2._M_allocated_capacity = (size_type)&arguments;
    executable_path.field_2._8_8_ = &c_path;
    IndentPrinter::
    println_increasing<PrintFunctor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_2_>>
              (&printer,(PrintFunctor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]moebius_codegen_c_hpp:1005:45)>
                         *)&executable_path);
    bVar2 = TailCallData::has_tail_call(tail_call_data,(Function *)c_path._M_dataplus._M_p);
    if (bVar2) {
      IndentPrinter::println_increasing<char[12]>(&printer,(char (*) [12])"while (1) {");
    }
    result.index = arguments;
    iVar3 = (**(code **)(**(long **)(c_path._M_dataplus._M_p + 0x50) + 0x10))();
    pFVar1 = local_948;
    if (iVar3 != 9) {
      result_type = FunctionTable::get_type
                              (&function_table,*(Type **)(c_path._M_dataplus._M_p + 0x50));
      executable_path._M_dataplus._M_p = (pointer)&result_type;
      executable_path._M_string_length = (size_type)&result;
      executable_path.field_2._8_8_ = (long)"% % = % % %;" + 8;
      IndentPrinter::println<Format<CodegenC::Type,Variable>>
                (&printer,(Format<CodegenC::Type,_Variable> *)&executable_path);
    }
    evaluate(&function_table,&printer,arguments + 1,result,tail_call_data,
             (Block *)(c_path._M_dataplus._M_p + 0x20));
    iVar3 = (**(code **)(**(long **)(c_path._M_dataplus._M_p + 0x50) + 0x10))();
    if (iVar3 == 9) {
      IndentPrinter::println<char[8]>(&printer,(char (*) [8])"return;");
    }
    else {
      executable_path._M_dataplus._M_p = (pointer)&result;
      executable_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_37e6b;
      IndentPrinter::println<Format<Variable>>(&printer,(Format<Variable> *)&executable_path);
    }
    bVar2 = TailCallData::has_tail_call(tail_call_data,(Function *)c_path._M_dataplus._M_p);
    if (bVar2) {
      IndentPrinter::println_decreasing<char[2]>(&printer,(char (*) [2])0x13589a);
    }
    IndentPrinter::println_decreasing<char[2]>(&printer,(char (*) [2])0x13589a);
    program = (Program *)&pFVar1->next_function;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executable_path,source_path,(allocator<char> *)&command);
  std::operator+(&c_path,&executable_path,".c");
  std::__cxx11::string::~string((string *)&executable_path);
  std::ofstream::ofstream(&executable_path,(string *)&c_path,_S_out);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&executable_path,(string *)&command);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&executable_path,(string *)&command);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&executable_path,(string *)&command);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&executable_path,(string *)&command);
  std::__cxx11::string::~string((string *)&command);
  std::ofstream::~ofstream(&executable_path);
  status_printer.ostream = (ostream *)&std::cerr;
  executable_path._M_dataplus._M_p = "\x1b[1m";
  executable_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_38d3f;
  executable_path._M_string_length = (size_type)&c_path;
  PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
  ::print((PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
           *)&executable_path,&status_printer);
  command._M_dataplus._M_p = "\x1b[32m";
  command._M_string_length = (size_type)anon_var_dwarf_37eab;
  command.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_38d8f;
  executable_path._M_dataplus._M_p = "\x1b[1m";
  executable_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_38d3f;
  executable_path._M_string_length = (size_type)&command;
  PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]>::print
            ((PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]> *)
             &executable_path,&status_printer);
  std::ostream::put((char)status_printer.ostream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,source_path,(allocator<char> *)&index);
  std::operator+(&executable_path,&command,".exe");
  std::__cxx11::string::~string((string *)&command);
  __s = getenv((CodegenC *)"CC","cc");
  __rhs = getenv((CodegenC *)"CFLAGS","");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,__s,&local_9f1);
  std::operator+(&local_8d0,&local_8f0," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_type,
                 &local_8d0,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_type,
                 " -o ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &executable_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments," "
                );
  std::operator+(&command,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &index,&c_path);
  std::__cxx11::string::~string((string *)&index);
  std::__cxx11::string::~string((string *)&arguments);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&result_type);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8f0);
  iVar3 = system(command._M_dataplus._M_p);
  if (iVar3 == 0) {
    index = (size_t)anon_var_dwarf_38d33;
    local_958 = "\x1b[22m";
    local_960 = &executable_path;
    PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
    ::print((PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
             *)&index,&status_printer);
    arguments = (size_t)anon_var_dwarf_38d83;
    local_980 = " successfully generated";
    local_978 = "\x1b[39m";
    index = (size_t)anon_var_dwarf_38d33;
    local_958 = "\x1b[22m";
    local_960 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments;
    PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]>::print
              ((PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]> *)&index,
               &status_printer);
    std::ostream::put((char)status_printer.ostream);
  }
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)&executable_path);
  std::__cxx11::string::~string((string *)&c_path);
  FunctionTable::~FunctionTable(&function_table);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&functions);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&type_functions);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&function_declarations);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&type_declarations);
  return;
}

Assistant:

static void codegen(const Program& program, const char* source_path, const TailCallData& tail_call_data) {
		std::ostringstream type_declarations;
		std::ostringstream function_declarations;
		std::ostringstream type_functions;
		std::ostringstream functions;
		IndentPrinter type_declaration_printer(type_declarations);
		IndentPrinter function_declaration_printer(function_declarations);
		IndentPrinter type_function_printer(type_functions);
		IndentPrinter printer(functions);
		FunctionTable function_table(type_declaration_printer, function_declaration_printer, type_function_printer);
		type_declaration_printer.println("#include <stdlib.h>");
		type_declaration_printer.println("#include <stdint.h>");
		type_declaration_printer.println("#include <stdio.h>");
		{
			printer.println_increasing("int main(int argc, char **argv) {");
			const std::size_t index = function_table.look_up(program.get_main_function());
			printer.println(format("f%();", print_number(index)));
			printer.println("return 0;");
			printer.println_decreasing("}");
		}
		for (const Function* function: program) {
			const Type return_type = function_table.get_type(function->get_return_type());
			const std::size_t index = function_table.look_up(function);
			const std::size_t arguments = function->get_argument_types().size();
			function_declaration_printer.println(print_functor([&](auto& printer) {
				printer.print(format("static % f%(", return_type, print_number(index)));
				bool is_first_argument = true;
				for (std::size_t i = 0; i < arguments; ++i) {
					if (function->get_argument_types()[i] != TypeInterner::get_void_type()) {
						if (is_first_argument) is_first_argument = false;
						else printer.print(", ");
						const Type argument_type = function_table.get_type(function->get_argument_types()[i]);
						printer.print(format("% %", argument_type, Variable(i)));
					}
				}
				printer.print(");");
			}));
			printer.println_increasing(print_functor([&](auto& printer) {
				printer.print(format("static % f%(", return_type, print_number(index)));
				bool is_first_argument = true;
				for (std::size_t i = 0; i < arguments; ++i) {
					if (function->get_argument_types()[i] != TypeInterner::get_void_type()) {
						if (is_first_argument) is_first_argument = false;
						else printer.print(", ");
						const Type argument_type = function_table.get_type(function->get_argument_types()[i]);
						printer.print(format("% %", argument_type, Variable(i)));
					}
				}
				printer.print(") {");
			}));
			if (tail_call_data.has_tail_call(function)) {
				printer.println_increasing("while (1) {");
			}
			const Variable result = Variable(arguments);
			if (function->get_return_type()->get_id() != TypeId::VOID) {
				const Type result_type = function_table.get_type(function->get_return_type());
				printer.println(format("% %;", result_type, result));
			}
			CodegenC::evaluate(function_table, printer, arguments + 1, result, tail_call_data, function->get_block());
			if (function->get_return_type()->get_id() != TypeId::VOID) {
				printer.println(format("return %;", result));
			}
			else {
				printer.println("return;");
			}
			if (tail_call_data.has_tail_call(function)) {
				printer.println_decreasing("}");
			}
			printer.println_decreasing("}");
		}
		std::string c_path = std::string(source_path) + ".c";
		{
			std::ofstream file(c_path);
			file << type_declarations.str();
			file << function_declarations.str();
			file << type_functions.str();
			file << functions.str();
		}
		Printer status_printer(std::cerr);
		status_printer.print(bold(c_path));
		status_printer.print(bold(green(" successfully generated")));
		status_printer.print('\n');
		std::string executable_path = std::string(source_path) + ".exe";
		const char* c_compiler = getenv("CC", "cc");
		const char* compiler_arguments = getenv("CFLAGS", "");
		std::string command = std::string(c_compiler) + " " + compiler_arguments + " -o " + executable_path + " " + c_path;
		if (std::system(command.c_str()) == 0) {
			status_printer.print(bold(executable_path));
			status_printer.print(bold(green(" successfully generated")));
			status_printer.print('\n');
		}
	}